

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O3

string * GetAddressAndPortAsString_abi_cxx11_(string *__return_storage_ptr__,Address address)

{
  size_type *psVar1;
  undefined8 uVar2;
  Address address_00;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  uint __val;
  ulong uVar6;
  ulong uVar7;
  ushort uVar8;
  uint __len;
  string __str;
  ulong *local_88;
  long local_80;
  ulong in_stack_ffffffffffffff88;
  uchar in_stack_ffffffffffffff90 [8];
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  address_00.sin_zero = in_stack_ffffffffffffff90;
  address_00._0_8_ = in_stack_ffffffffffffff88;
  GetAddressAsString_abi_cxx11_(address_00);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_48);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    uVar7 = *puVar5;
    local_88 = (ulong *)&stack0xffffffffffffff88;
  }
  else {
    uVar7 = *puVar5;
    local_88 = (ulong *)*plVar3;
  }
  local_80 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  uVar8 = address.sin_port << 8 | address.sin_port >> 8;
  *(undefined1 *)(plVar3 + 2) = 0;
  __val = (uint)uVar8;
  __len = 1;
  if (((9 < uVar8) && (__len = 2, 99 < uVar8)) && (__len = 3, 999 < __val)) {
    __len = 5 - (__val < 10000);
  }
  local_68 = local_58;
  std::__cxx11::string::_M_construct((ulong)&local_68,(char)__len);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_68,__len,__val);
  uVar6 = 0xf;
  if (local_88 != (ulong *)&stack0xffffffffffffff88) {
    uVar6 = uVar7;
  }
  if (uVar6 < (ulong)(local_60 + local_80)) {
    uVar7 = 0xf;
    if (local_68 != local_58) {
      uVar7 = local_58[0];
    }
    if ((ulong)(local_60 + local_80) <= uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_88);
      goto LAB_0010c9b9;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68);
LAB_0010c9b9:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar2 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if (local_88 != (ulong *)&stack0xffffffffffffff88) {
    operator_delete(local_88);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetAddressAndPortAsString(Address address){
    std::string s = GetAddressAsString(address) + ":" + std::to_string(GetPort(address));
    return s;
}